

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

int Prs_ManReadLatch(Prs_Man_t *p)

{
  int iVar1;
  int local_1c;
  int iToken;
  Prs_Man_t *p_local;
  
  iVar1 = Prs_ManReadName(p);
  Vec_IntClear(&p->vTemp);
  if (iVar1 == 0) {
    p_local._4_4_ = Prs_ManErrorSet(p,"Cannot read latch input.",1);
  }
  else {
    Vec_IntWriteEntry(&p->vTemp,1,iVar1);
    iVar1 = Prs_ManReadName(p);
    if (iVar1 == 0) {
      p_local._4_4_ = Prs_ManErrorSet(p,"Cannot read latch output.",1);
    }
    else {
      Vec_IntWriteEntry(&p->vTemp,0,iVar1);
      Prs_ManSkipSpaces(p);
      iVar1 = Prs_ManIsChar(p,'0');
      if (iVar1 == 0) {
        iVar1 = Prs_ManIsChar(p,'1');
        if (iVar1 == 0) {
          local_1c = 2;
        }
        else {
          local_1c = 1;
        }
      }
      else {
        local_1c = 0;
      }
      Prs_ManSkipToChar(p,'\n');
      Prs_NtkAddBox(p->pNtk,-1,local_1c,&p->vTemp);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManReadLatch( Prs_Man_t * p )
{
    int iToken = Prs_ManReadName(p);
    Vec_IntClear( &p->vTemp );
    if ( iToken == 0 )                 return Prs_ManErrorSet(p, "Cannot read latch input.", 1);
    Vec_IntWriteEntry( &p->vTemp, 1, iToken );
    iToken = Prs_ManReadName(p);
    if ( iToken == 0 )                 return Prs_ManErrorSet(p, "Cannot read latch output.", 1);
    Vec_IntWriteEntry( &p->vTemp, 0, iToken );
    Prs_ManSkipSpaces( p );
    if ( Prs_ManIsChar(p, '0') )
        iToken = 0;
    else if ( Prs_ManIsChar(p, '1') )
        iToken = 1;
    else 
        iToken = 2;
    Prs_ManSkipToChar( p, '\n' );
    // save results
    Prs_NtkAddBox( p->pNtk, -1, iToken, &p->vTemp ); // -1 stands for latch
    return 0;
}